

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void SUNDlsMat_denseMatvec(realtype **a,realtype *x,realtype *y,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  realtype *col_j;
  sunindextype j;
  sunindextype i;
  sunindextype n_local;
  sunindextype m_local;
  realtype *y_local;
  realtype *x_local;
  realtype **a_local;
  
  for (i = 0; i < m; i = i + 1) {
    y[i] = 0.0;
  }
  for (j = 0; j < n; j = j + 1) {
    prVar1 = a[j];
    for (i = 0; i < m; i = i + 1) {
      y[i] = prVar1[i] * x[j] + y[i];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_denseMatvec(realtype **a, realtype *x, realtype *y, sunindextype m, sunindextype n)
{
  sunindextype i, j;
  realtype *col_j;

  for (i=0; i<m; i++) {
    y[i] = 0.0;
  }

  for (j=0; j<n; j++) {
    col_j = a[j];
    for (i=0; i<m; i++)
      y[i] += col_j[i]*x[j];
  }
}